

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_threaded_clusterizer.h
# Opt level: O0

bool __thiscall
crnlib::threaded_clusterizer<crnlib::vec<16U,_float>_>::create_clusters
          (threaded_clusterizer<crnlib::vec<16U,_float>_> *this,weighted_vec_array *weighted_vecs,
          uint max_clusters,vector<crnlib::vector<unsigned_int>_> *cluster_indices,
          progress_callback_func pProgress_callback,void *pProgress_callback_data)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  crn_thread_id_t cVar6;
  uint *puVar7;
  vector<crnlib::vector<unsigned_int>_> *in_RCX;
  uint in_EDX;
  vector<crnlib::threaded_clusterizer<crnlib::vec<16U,_float>_>::weighted_vec> *in_RSI;
  long in_RDI;
  undefined8 in_R8;
  undefined8 in_R9;
  uint num_clusters;
  weighted_vec *v;
  uint i_5;
  uint j;
  uint ofs;
  uint i_4;
  uint i_3;
  uint total_clusters;
  uint num_indices_1;
  uint i_2;
  uint num_indices;
  uint i_1;
  uint total_partitions;
  create_clusters_task_state task_state [4];
  vector<unsigned_int> indices [6];
  uint i;
  vector<unsigned_int> primary_indices;
  undefined4 in_stack_fffffffffffffd38;
  uint in_stack_fffffffffffffd3c;
  undefined4 in_stack_fffffffffffffd40;
  undefined4 in_stack_fffffffffffffd44;
  undefined8 in_stack_fffffffffffffd48;
  vector<crnlib::vector<unsigned_int>_> *in_stack_fffffffffffffd50;
  uint64 in_stack_fffffffffffffd58;
  task_pool *in_stack_fffffffffffffd60;
  uint in_stack_fffffffffffffd6c;
  threaded_clusterizer<crnlib::vec<16U,_float>_> *in_stack_fffffffffffffd70;
  vector<unsigned_int> *pvVar8;
  task_pool *in_stack_fffffffffffffd78;
  vector<unsigned_int> *pvVar9;
  undefined8 in_stack_fffffffffffffd80;
  vec<16U,_float> *in_stack_fffffffffffffd88;
  clusterizer<crnlib::vec<16U,_float>_> *in_stack_fffffffffffffd90;
  vector<unsigned_int> *local_268;
  vector<crnlib::vector<unsigned_int>_> *in_stack_fffffffffffffdb0;
  uint in_stack_fffffffffffffdbc;
  clusterizer<crnlib::vec<16U,_float>_> *in_stack_fffffffffffffdc0;
  vector<unsigned_int> *in_stack_fffffffffffffdc8;
  vector<unsigned_int> *in_stack_fffffffffffffdd0;
  weighted_vec_array *in_stack_fffffffffffffdd8;
  threaded_clusterizer<crnlib::vec<16U,_float>_> *in_stack_fffffffffffffde0;
  vector<unsigned_int> *local_200;
  vector<unsigned_int> *local_1e0;
  uint local_1ac;
  uint local_1a8;
  uint local_1a0;
  uint local_19c;
  uint local_178;
  uint local_170;
  uint local_16c;
  vector<unsigned_int> local_168;
  vector<crnlib::vector<unsigned_int>_> vStack_158;
  uint auStack_148 [5];
  undefined1 in_stack_fffffffffffffecf;
  void *in_stack_fffffffffffffed0;
  progress_callback_func_ptr in_stack_fffffffffffffed8;
  uint in_stack_fffffffffffffee4;
  clusterizer<crnlib::vec<16U,_float>_> *in_stack_fffffffffffffee8;
  vector<unsigned_int> local_c8 [6];
  vector<unsigned_int> vStack_68;
  uint local_4c;
  vector<unsigned_int> local_48;
  undefined8 local_38;
  undefined8 local_30;
  vector<crnlib::vector<unsigned_int>_> *local_28;
  uint local_1c;
  vector<crnlib::threaded_clusterizer<crnlib::vec<16U,_float>_>::weighted_vec> *local_18;
  byte local_1;
  
  local_38 = in_R9;
  local_30 = in_R8;
  local_28 = in_RCX;
  local_1c = in_EDX;
  local_18 = in_RSI;
  cVar6 = crn_get_current_thread_id();
  *(crn_thread_id_t *)(in_RDI + 8) = cVar6;
  *(undefined1 *)(in_RDI + 0x1e8) = 0;
  *(undefined8 *)(in_RDI + 0x1d8) = local_30;
  *(undefined8 *)(in_RDI + 0x1e0) = local_38;
  if (local_1c < 0x80) {
    clusterizer<crnlib::vec<16U,_float>_>::clear
              ((clusterizer<crnlib::vec<16U,_float>_> *)
               CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40));
    clusterizer<crnlib::vec<16U,_float>_>::get_training_vecs
              ((clusterizer<crnlib::vec<16U,_float>_> *)(in_RDI + 0x10));
    vector<crnlib::threaded_clusterizer<crnlib::vec<16U,_float>_>::weighted_vec>::size(local_18);
    vector<std::pair<crnlib::vec<16U,_float>,_unsigned_int>_>::reserve
              ((vector<std::pair<crnlib::vec<16U,_float>,_unsigned_int>_> *)
               in_stack_fffffffffffffd70,in_stack_fffffffffffffd6c);
    local_1ac = 0;
    while (uVar4 = local_1ac,
          uVar5 = vector<crnlib::threaded_clusterizer<crnlib::vec<16U,_float>_>::weighted_vec>::size
                            (local_18), uVar4 < uVar5) {
      vector<crnlib::threaded_clusterizer<crnlib::vec<16U,_float>_>::weighted_vec>::operator[]
                (local_18,local_1ac);
      clusterizer<crnlib::vec<16U,_float>_>::add_training_vec
                (in_stack_fffffffffffffd90,in_stack_fffffffffffffd88,
                 (uint)((ulong)in_stack_fffffffffffffd80 >> 0x20));
      local_1ac = local_1ac + 1;
    }
    clusterizer<crnlib::vec<16U,_float>_>::generate_codebook
              (in_stack_fffffffffffffee8,in_stack_fffffffffffffee4,in_stack_fffffffffffffed8,
               in_stack_fffffffffffffed0,(bool)in_stack_fffffffffffffecf);
    clusterizer<crnlib::vec<16U,_float>_>::get_codebook_size
              ((clusterizer<crnlib::vec<16U,_float>_> *)0x17ec79);
    clusterizer<crnlib::vec<16U,_float>_>::retrieve_clusters
              (in_stack_fffffffffffffdc0,in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb0);
  }
  else {
    vector<crnlib::threaded_clusterizer<crnlib::vec<16U,_float>_>::weighted_vec>::size(local_18);
    vector<unsigned_int>::vector
              ((vector<unsigned_int> *)CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40)
               ,in_stack_fffffffffffffd3c);
    for (local_4c = 0; uVar2 = local_4c,
        uVar4 = vector<crnlib::threaded_clusterizer<crnlib::vec<16U,_float>_>::weighted_vec>::size
                          (local_18), uVar3 = local_4c, uVar2 < uVar4; local_4c = local_4c + 1) {
      puVar7 = vector<unsigned_int>::operator[](&local_48,local_4c);
      *puVar7 = uVar3;
    }
    local_1e0 = local_c8;
    do {
      vector<unsigned_int>::vector(local_1e0);
      local_1e0 = local_1e0 + 1;
    } while (local_1e0 != &vStack_68);
    compute_split(in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0,
                  in_stack_fffffffffffffdc8,(vector<unsigned_int> *)in_stack_fffffffffffffdc0);
    compute_split(in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0,
                  in_stack_fffffffffffffdc8,(vector<unsigned_int> *)in_stack_fffffffffffffdc0);
    compute_split(in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0,
                  in_stack_fffffffffffffdc8,(vector<unsigned_int> *)in_stack_fffffffffffffdc0);
    local_200 = &local_168;
    do {
      create_clusters_task_state::create_clusters_task_state
                ((create_clusters_task_state *)
                 CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40));
      local_200 = (vector<unsigned_int> *)&local_200[2].m_size;
    } while (local_200 != local_c8);
    *(undefined1 *)(in_RDI + 0x1d0) = 0;
    local_16c = 0;
    for (local_170 = 0; local_170 < 4; local_170 = local_170 + 1) {
      uVar4 = vector<unsigned_int>::size(local_c8 + (local_170 + 2));
      if (uVar4 != 0) {
        local_16c = local_16c + 1;
      }
    }
    for (local_178 = 0; local_178 < 4; local_178 = local_178 + 1) {
      uVar4 = vector<unsigned_int>::size(local_c8 + (local_178 + 2));
      if (uVar4 != 0) {
        *(vector<crnlib::threaded_clusterizer<crnlib::vec<16U,_float>_>::weighted_vec> **)
         ((long)&local_168 + (ulong)local_178 * 0x28) = local_18;
        *(vector<unsigned_int> **)((long)&local_168 + (ulong)local_178 * 0x28 + 8) =
             local_c8 + (local_178 + 2);
        auStack_148[(ulong)local_178 * 10] = (local_1c + (local_16c >> 1)) / local_16c;
        task_pool::
        queue_object_task<crnlib::threaded_clusterizer<crnlib::vec<16u,float>>,void(crnlib::threaded_clusterizer<crnlib::vec<16u,float>>::*)(unsigned_long_long,void*)>
                  (in_stack_fffffffffffffd78,in_stack_fffffffffffffd70,
                   (offset_in_threaded_clusterizer<crnlib::vec<16U,_float>_>_to_subr)
                   in_stack_fffffffffffffd60,in_stack_fffffffffffffd58,in_stack_fffffffffffffd50);
      }
    }
    task_pool::join(in_stack_fffffffffffffd60);
    if ((*(byte *)(in_RDI + 0x1e8) & 1) == 0) {
      for (local_19c = 0; local_19c < 4; local_19c = local_19c + 1) {
        vector<crnlib::vector<unsigned_int>_>::size
                  ((vector<crnlib::vector<unsigned_int>_> *)
                   ((long)&vStack_158 + (ulong)local_19c * 0x28));
      }
      vector<crnlib::vector<unsigned_int>_>::reserve
                ((vector<crnlib::vector<unsigned_int>_> *)in_stack_fffffffffffffd70,
                 in_stack_fffffffffffffd6c);
      vector<crnlib::vector<unsigned_int>_>::resize
                (in_stack_fffffffffffffd50,(uint)((ulong)in_stack_fffffffffffffd48 >> 0x20),
                 SUB81((ulong)in_stack_fffffffffffffd48 >> 0x18,0));
      for (local_1a0 = 0; local_1a0 < 4; local_1a0 = local_1a0 + 1) {
        uVar4 = vector<crnlib::vector<unsigned_int>_>::size(local_28);
        vector<crnlib::vector<unsigned_int>_>::size
                  ((vector<crnlib::vector<unsigned_int>_> *)
                   ((long)&vStack_158 + (ulong)local_1a0 * 0x28));
        vector<crnlib::vector<unsigned_int>_>::resize
                  (in_stack_fffffffffffffd50,(uint)((ulong)in_stack_fffffffffffffd48 >> 0x20),
                   SUB81((ulong)in_stack_fffffffffffffd48 >> 0x18,0));
        for (local_1a8 = 0;
            uVar5 = vector<crnlib::vector<unsigned_int>_>::size
                              ((vector<crnlib::vector<unsigned_int>_> *)
                               ((long)&vStack_158 + (ulong)local_1a0 * 0x28)), local_1a8 < uVar5;
            local_1a8 = local_1a8 + 1) {
          vector<crnlib::vector<unsigned_int>_>::operator[](local_28,uVar4 + local_1a8);
          vector<crnlib::vector<unsigned_int>_>::operator[]
                    ((vector<crnlib::vector<unsigned_int>_> *)
                     ((long)&vStack_158 + (ulong)local_1a0 * 0x28),local_1a8);
          vector<unsigned_int>::swap
                    ((vector<unsigned_int> *)
                     CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40),
                     (vector<unsigned_int> *)
                     CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38));
        }
      }
      bVar1 = false;
    }
    else {
      local_1 = 0;
      bVar1 = true;
    }
    pvVar9 = &local_168;
    local_268 = local_c8;
    do {
      local_268 = (vector<unsigned_int> *)&local_268[-3].m_size;
      create_clusters_task_state::~create_clusters_task_state
                ((create_clusters_task_state *)0x17ea8b);
    } while (local_268 != pvVar9);
    pvVar9 = local_c8;
    pvVar8 = &vStack_68;
    do {
      pvVar8 = pvVar8 + -1;
      vector<unsigned_int>::~vector
                ((vector<unsigned_int> *)
                 CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40));
    } while (pvVar8 != pvVar9);
    vector<unsigned_int>::~vector
              ((vector<unsigned_int> *)CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40)
              );
    if (bVar1) goto LAB_0017ecb9;
  }
  local_1 = (*(byte *)(in_RDI + 0x1e8) ^ 0xff) & 1;
LAB_0017ecb9:
  return (bool)(local_1 & 1);
}

Assistant:

bool create_clusters(
      const weighted_vec_array& weighted_vecs,
      uint max_clusters, crnlib::vector<crnlib::vector<uint> >& cluster_indices,
      progress_callback_func pProgress_callback,
      void* pProgress_callback_data) {
    m_main_thread_id = crn_get_current_thread_id();
    m_canceled = false;
    m_pProgress_callback = pProgress_callback;
    m_pProgress_callback_data = pProgress_callback_data;

    if (max_clusters >= 128) {
      crnlib::vector<uint> primary_indices(weighted_vecs.size());
      for (uint i = 0; i < weighted_vecs.size(); i++)
        primary_indices[i] = i;

      CRNLIB_ASSUME(cMaxClusterizers == 4);

      crnlib::vector<uint> indices[6];

      compute_split(weighted_vecs, primary_indices, indices[0], indices[1]);
      compute_split(weighted_vecs, indices[0], indices[2], indices[3]);
      compute_split(weighted_vecs, indices[1], indices[4], indices[5]);

      create_clusters_task_state task_state[4];

      m_cluster_task_displayed_progress = false;

      uint total_partitions = 0;
      for (uint i = 0; i < 4; i++) {
        const uint num_indices = indices[2 + i].size();
        if (num_indices)
          total_partitions++;
      }

      for (uint i = 0; i < 4; i++) {
        const uint num_indices = indices[2 + i].size();
        if (!num_indices)
          continue;

        task_state[i].m_pWeighted_vecs = &weighted_vecs;
        task_state[i].m_pIndices = &indices[2 + i];
        task_state[i].m_max_clusters = (max_clusters + (total_partitions / 2)) / total_partitions;

        m_pTask_pool->queue_object_task(this, &threaded_clusterizer::create_clusters_task, i, &task_state[i]);
      }

      m_pTask_pool->join();

      if (m_canceled)
        return false;

      uint total_clusters = 0;
      for (uint i = 0; i < 4; i++)
        total_clusters += task_state[i].m_cluster_indices.size();

      cluster_indices.reserve(total_clusters);
      cluster_indices.resize(0);

      for (uint i = 0; i < 4; i++) {
        const uint ofs = cluster_indices.size();

        cluster_indices.resize(ofs + task_state[i].m_cluster_indices.size());

        for (uint j = 0; j < task_state[i].m_cluster_indices.size(); j++) {
          cluster_indices[ofs + j].swap(task_state[i].m_cluster_indices[j]);
        }
      }
    } else {
      m_clusterizers[0].clear();
      m_clusterizers[0].get_training_vecs().reserve(weighted_vecs.size());

      for (uint i = 0; i < weighted_vecs.size(); i++) {
        const weighted_vec& v = weighted_vecs[i];

        m_clusterizers[0].add_training_vec(v.m_vec, v.m_weight);
      }

      m_clusterizers[0].generate_codebook(max_clusters, generate_codebook_progress_callback, this, false);  //m_params.m_dxt_quality <= cCRNDXTQualityFast);

      const uint num_clusters = m_clusterizers[0].get_codebook_size();

      m_clusterizers[0].retrieve_clusters(num_clusters, cluster_indices);
    }

    return !m_canceled;
  }